

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_set.cpp
# Opt level: O3

SourceResultType __thiscall
duckdb::PhysicalSet::GetData
          (PhysicalSet *this,ExecutionContext *context,DataChunk *chunk,OperatorSourceInput *input)

{
  string *name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ClientContext *context_00;
  pointer pcVar2;
  DBConfig *pDVar3;
  DatabaseInstance *db;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_true>
  _Var4;
  InternalException *this_00;
  CatalogException *pCVar5;
  SetScope SVar6;
  optional_ptr<const_duckdb::ConfigurationOption,_true> option;
  Value input_val;
  optional_ptr<const_duckdb::ConfigurationOption,_true> local_f0;
  allocator local_e1;
  string local_e0;
  LogicalType local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Value local_68;
  
  pDVar3 = DBConfig::GetConfig(context->client);
  name = &this->name;
  DBConfig::CheckLock(pDVar3,name);
  local_f0 = DBConfig::GetOptionByName(name);
  if (local_f0.ptr == (ConfigurationOption *)0x0) {
    _Var4._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(pDVar3->extension_parameters)._M_h,name);
    if (_Var4._M_cur == (__node_type *)0x0) {
      Catalog::AutoloadExtensionByConfigName(context->client,name);
      _Var4._M_cur = (__node_type *)
                     ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(pDVar3->extension_parameters)._M_h,name);
    }
    SetExtensionVariable
              (context->client,
               (ExtensionOption *)
               ((long)&((_Var4._M_cur)->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>_>
                       ._M_storage._M_storage + 0x20),name,this->scope,&this->value);
  }
  else {
    SVar6 = this->scope;
    if (SVar6 == AUTOMATIC) {
      optional_ptr<const_duckdb::ConfigurationOption,_true>::CheckValid(&local_f0);
      SVar6 = (local_f0.ptr)->set_local == (set_local_function_t)0x0 | SESSION;
    }
    context_00 = context->client;
    optional_ptr<const_duckdb::ConfigurationOption,_true>::CheckValid(&local_f0);
    ::std::__cxx11::string::string((string *)&local_e0,(local_f0.ptr)->parameter_type,&local_e1);
    DBConfig::ParseLogicalType(&local_c0,&local_e0);
    Value::CastAs(&local_68,&this->value,context_00,&local_c0,false);
    LogicalType::~LogicalType(&local_c0);
    paVar1 = &local_e0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    if (SVar6 == SESSION) {
      optional_ptr<const_duckdb::ConfigurationOption,_true>::CheckValid(&local_f0);
      if ((local_f0.ptr)->set_local == (set_local_function_t)0x0) {
        pCVar5 = (CatalogException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"option \"%s\" cannot be set locally","");
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        pcVar2 = (this->name)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar2,pcVar2 + (this->name)._M_string_length);
        CatalogException::CatalogException<std::__cxx11::string>(pCVar5,&local_e0,&local_a8);
        __cxa_throw(pCVar5,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
      }
      optional_ptr<const_duckdb::ConfigurationOption,_true>::CheckValid(&local_f0);
      (*(local_f0.ptr)->set_local)(context->client,&local_68);
    }
    else {
      if (SVar6 != GLOBAL) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"Unsupported SetScope for variable","");
        InternalException::InternalException(this_00,&local_e0);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      optional_ptr<const_duckdb::ConfigurationOption,_true>::CheckValid(&local_f0);
      if ((local_f0.ptr)->set_global == (set_global_function_t)0x0) {
        pCVar5 = (CatalogException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"option \"%s\" cannot be set globally","");
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        pcVar2 = (this->name)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,pcVar2,pcVar2 + (this->name)._M_string_length);
        CatalogException::CatalogException<std::__cxx11::string>(pCVar5,&local_e0,&local_88);
        __cxa_throw(pCVar5,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
      }
      db = DatabaseInstance::GetDatabase(context->client);
      pDVar3 = DBConfig::GetConfig(context->client);
      optional_ptr<const_duckdb::ConfigurationOption,_true>::CheckValid(&local_f0);
      DBConfig::SetOption(pDVar3,db,local_f0.ptr,&local_68);
    }
    Value::~Value(&local_68);
  }
  return FINISHED;
}

Assistant:

SourceResultType PhysicalSet::GetData(ExecutionContext &context, DataChunk &chunk, OperatorSourceInput &input) const {
	auto &config = DBConfig::GetConfig(context.client);
	// check if we are allowed to change the configuration option
	config.CheckLock(name);
	auto option = DBConfig::GetOptionByName(name);
	if (!option) {
		// check if this is an extra extension variable
		auto entry = config.extension_parameters.find(name);
		if (entry == config.extension_parameters.end()) {
			Catalog::AutoloadExtensionByConfigName(context.client, name);
			entry = config.extension_parameters.find(name);
			D_ASSERT(entry != config.extension_parameters.end());
		}
		SetExtensionVariable(context.client, entry->second, name, scope, value);
		return SourceResultType::FINISHED;
	}
	SetScope variable_scope = scope;
	if (variable_scope == SetScope::AUTOMATIC) {
		if (option->set_local) {
			variable_scope = SetScope::SESSION;
		} else {
			D_ASSERT(option->set_global);
			variable_scope = SetScope::GLOBAL;
		}
	}

	Value input_val = value.CastAs(context.client, DBConfig::ParseLogicalType(option->parameter_type));
	switch (variable_scope) {
	case SetScope::GLOBAL: {
		if (!option->set_global) {
			throw CatalogException("option \"%s\" cannot be set globally", name);
		}
		auto &db = DatabaseInstance::GetDatabase(context.client);
		auto &config = DBConfig::GetConfig(context.client);
		config.SetOption(&db, *option, input_val);
		break;
	}
	case SetScope::SESSION:
		if (!option->set_local) {
			throw CatalogException("option \"%s\" cannot be set locally", name);
		}
		option->set_local(context.client, input_val);
		break;
	default:
		throw InternalException("Unsupported SetScope for variable");
	}

	return SourceResultType::FINISHED;
}